

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_lcp_3way<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_output_00;
  lcp_t *lcp_output_00;
  lcp_t *lcp_output_01;
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  MergeResult MVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  uchar **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  uchar **ppuVar10;
  lcp_t *plVar11;
  lcp_t *plVar12;
  lcp_t *plVar13;
  lcp_t lVar14;
  uchar **ppuVar15;
  uchar **from0;
  lcp_t *__dest;
  char *__assertion;
  byte bVar16;
  uchar uVar17;
  size_t n_00;
  byte bVar18;
  long lVar19;
  MergeResult MVar20;
  size_t n_01;
  size_t sVar21;
  undefined1 auVar22 [16];
  double dVar23;
  lcp_t *in_stack_ffffffffffffff48;
  size_t local_90;
  
  if (n < 0x20) {
    if (1 < n) {
      uVar8 = n & 0xffffffff;
      ppuVar7 = strings_input;
      do {
        pbVar1 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar10 = ppuVar7; strings_input < ppuVar10; ppuVar10 = ppuVar10 + -1) {
          pbVar2 = ppuVar10[-1];
          bVar16 = *pbVar2;
          bVar18 = *pbVar1;
          if (bVar16 != 0 && bVar16 == bVar18) {
            lVar19 = 1;
            do {
              bVar16 = pbVar2[lVar19];
              bVar18 = pbVar1[lVar19];
              if (bVar16 == 0) break;
              lVar19 = lVar19 + 1;
            } while (bVar16 == bVar18);
          }
          if (bVar16 <= bVar18) break;
          *ppuVar10 = pbVar2;
        }
        iVar3 = (int)uVar8;
        uVar8 = (ulong)(iVar3 - 1);
        *ppuVar10 = pbVar1;
      } while (2 < iVar3);
    }
    if (n == 1) {
      return SortedInPlace;
    }
    uVar8 = 0;
    do {
      uVar9 = uVar8 + 1 & 0xffffffff;
      uVar17 = *strings_input[uVar8];
      if (uVar17 == '\0') {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        do {
          if (uVar17 != strings_input[uVar9][lVar14]) break;
          uVar17 = strings_input[uVar8][lVar14 + 1];
          lVar14 = lVar14 + 1;
        } while (uVar17 != '\0');
      }
      lcp_input[uVar8] = lVar14;
      uVar8 = uVar8 + 1;
      if (n - 1 <= uVar9) {
        return SortedInPlace;
      }
    } while( true );
  }
  auVar22._8_4_ = (int)(n >> 0x20);
  auVar22._0_8_ = n;
  auVar22._12_4_ = 0x45300000;
  uVar9 = n / 3;
  dVar23 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
  uVar8 = (ulong)dVar23;
  uVar8 = (long)(dVar23 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
  MVar4 = mergesort_lcp_3way<true>(strings_input,strings_output,lcp_input,lcp_output,uVar9);
  plVar11 = lcp_input;
  ppuVar7 = strings_input;
  if (MVar4 != SortedInPlace) {
    plVar11 = lcp_output;
    ppuVar7 = strings_output;
  }
  check_input(ppuVar7,plVar11,uVar9);
  ppuVar7 = strings_input + uVar9;
  ppuVar10 = strings_output + uVar9;
  plVar11 = lcp_input + uVar9;
  lcp_output_01 = lcp_output + uVar9;
  n_00 = uVar8 - uVar9;
  MVar5 = mergesort_lcp_3way<true>(ppuVar7,ppuVar10,plVar11,lcp_output_01,n_00);
  plVar12 = plVar11;
  ppuVar15 = ppuVar7;
  if (MVar5 != SortedInPlace) {
    plVar12 = lcp_output_01;
    ppuVar15 = ppuVar10;
  }
  check_input(ppuVar15,plVar12,n_00);
  ppuVar15 = strings_input + uVar8;
  strings_output_00 = strings_output + uVar8;
  plVar12 = lcp_input + uVar8;
  lcp_output_00 = lcp_output + uVar8;
  n_01 = n - uVar8;
  MVar6 = mergesort_lcp_3way<true>(ppuVar15,strings_output_00,plVar12,lcp_output_00,n_01);
  plVar13 = plVar12;
  from0 = ppuVar15;
  if (MVar6 != SortedInPlace) {
    plVar13 = lcp_output_00;
    from0 = strings_output_00;
  }
  check_input(from0,plVar13,n_01);
  MVar20 = MVar4;
  if (MVar4 != MVar5) {
    sVar21 = uVar9 * 8;
    if (MVar5 == MVar6) {
      if (MVar4 == SortedInPlace) {
        memcpy(strings_output,strings_input,sVar21);
        memcpy(lcp_output,lcp_input,sVar21);
      }
      else {
        memcpy(strings_input,strings_output,sVar21);
        memcpy(lcp_input,lcp_output,sVar21);
      }
      MVar4 = (MergeResult)(MVar4 == SortedInPlace);
      MVar20 = MVar5;
    }
    else {
      if (MVar5 == SortedInPlace) {
        MVar5 = SortedInTemp;
        local_90 = uVar8 * 8 + uVar9 * -8;
        MVar20 = MVar5;
        if (local_90 == 0) goto LAB_001d3626;
        memcpy(ppuVar10,ppuVar7,local_90);
        plVar13 = plVar11;
        __dest = lcp_output_01;
      }
      else {
        MVar5 = SortedInPlace;
        local_90 = uVar8 * 8 + uVar9 * -8;
        MVar20 = SortedInPlace;
        if (local_90 == 0) goto LAB_001d3626;
        memcpy(ppuVar7,ppuVar10,local_90);
        plVar13 = lcp_output_01;
        __dest = plVar11;
      }
      memcpy(__dest,plVar13,local_90);
      MVar20 = MVar5;
    }
  }
LAB_001d3626:
  if (MVar20 != MVar6) {
    if (MVar6 == SortedInPlace) {
      MVar6 = SortedInTemp;
      sVar21 = n * 8 + uVar8 * -8;
      if (sVar21 != 0) {
        memcpy(strings_output_00,ppuVar15,sVar21);
        memcpy(lcp_output_00,plVar12,sVar21);
        MVar6 = SortedInTemp;
      }
    }
    else {
      MVar6 = SortedInPlace;
      sVar21 = n * 8 + uVar8 * -8;
      if (sVar21 != 0) {
        memcpy(ppuVar15,strings_output_00,sVar21);
        memcpy(plVar12,lcp_output_00,sVar21);
        MVar6 = SortedInPlace;
      }
    }
  }
  if (MVar4 == MVar20) {
    if (MVar4 == MVar6) {
      if (MVar4 != SortedInPlace) {
        merge_lcp_3way<false>
                  (strings_output,lcp_output,uVar9,ppuVar10,lcp_output_01,n_00,strings_output_00,
                   lcp_output_00,n_01,strings_input,in_stack_ffffffffffffff48);
        return SortedInPlace;
      }
      merge_lcp_3way<false>
                (strings_input,lcp_input,uVar9,ppuVar7,plVar11,n_00,ppuVar15,plVar12,n_01,
                 strings_output,in_stack_ffffffffffffff48);
      return SortedInTemp;
    }
    __assertion = "m1 == m2";
  }
  else {
    __assertion = "m0 == m1";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x31d,
                "MergeResult mergesort_lcp_3way(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
               );
}

Assistant:

MergeResult
mergesort_lcp_3way(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0 = mergesort_lcp_3way<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
	debug() << __func__ << "(): checking first merge\n";
	if (m0 == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);
	MergeResult m1 = mergesort_lcp_3way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
	debug() << __func__ << "(): checking second merge\n";
	if (m1 == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  split1-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, split1-split0);
	MergeResult m2 = mergesort_lcp_3way<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
	debug() << __func__ << "(): checking third merge\n";
	if (m2 == SortedInPlace) check_input(strings_input+split1,  lcp_input+split1,  n-split1);
	else                     check_input(strings_output+split1, lcp_output+split1, n-split1);
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}